

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_ns_local_search.h
# Opt level: O0

void __thiscall
fm_ns_local_search::move_node
          (fm_ns_local_search *this,AdjList *G,NodeID *node,PartitionID *to_block,
          PartitionID *other_block,vector<int,_std::allocator<int>_> *block_weights,
          vector<bool,_std::allocator<bool>_> *moved_out_of_S,
          vector<maxNodeHeap,_std::allocator<maxNodeHeap>_> *queues,
          vector<change_set,_std::allocator<change_set>_> *rollback_info)

{
  pointer *this_00;
  value_type vVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  reference piVar6;
  uint *puVar7;
  reference pvVar8;
  reference rVar9;
  iterator iStack_130;
  NodeID node_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  iterator iStack_110;
  NodeID node_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  uint local_f0;
  Gain toRHS;
  Gain toLHS;
  int v;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  _Bit_type local_c8;
  value_type local_ac;
  change_set cur_move_1;
  int neighbor;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  undefined1 local_80 [4];
  Gain gain_achieved;
  vector<int,_std::allocator<int>_> to_be_updated;
  vector<int,_std::allocator<int>_> to_be_added;
  value_type local_40;
  change_set cur_move;
  vector<int,_std::allocator<int>_> *block_weights_local;
  PartitionID *other_block_local;
  PartitionID *to_block_local;
  NodeID *node_local;
  AdjList *G_local;
  fm_ns_local_search *this_local;
  
  local_40.node = *node;
  cur_move = (change_set)block_weights;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this->partition_index,(long)*node);
  local_40.block = *pvVar4;
  std::vector<change_set,_std::allocator<change_set>_>::push_back(rollback_info,&local_40);
  vVar1 = *to_block;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this->partition_index,(long)*node);
  *pvVar4 = vVar1;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)cur_move,(long)*to_block);
  *pvVar4 = *pvVar4 + 1;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)cur_move,2);
  *pvVar4 = *pvVar4 + -1;
  join_0x00000010_0x00000000_ =
       std::vector<bool,_std::allocator<bool>_>::operator[](moved_out_of_S,(long)*node);
  std::_Bit_reference::operator=
            ((_Bit_reference *)
             &to_be_added.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,true);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &to_be_updated.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_80);
  pvVar5 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](G,(long)*node);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
  register0x00000000 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&cur_move_1.block), bVar2) {
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    cur_move_1.node = *piVar6;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this->x,(long)cur_move_1.node);
    if (*pvVar4 < 0) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (this->partition_index,(long)cur_move_1.node);
      if (*pvVar4 == *other_block) {
        local_ac.node = cur_move_1.node;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (this->partition_index,(long)cur_move_1.node);
        local_ac.block = *pvVar4;
        std::vector<change_set,_std::allocator<change_set>_>::push_back(rollback_info,&local_ac);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (this->partition_index,(long)cur_move_1.node);
        *pvVar4 = 2;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)cur_move,(long)*other_block);
        *pvVar4 = *pvVar4 + -1;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)cur_move,2);
        *pvVar4 = *pvVar4 + 1;
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (moved_out_of_S,(long)cur_move_1.node);
        local_c8 = rVar9._M_mask;
        __range4 = (value_type *)rVar9._M_p;
        bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range4);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &to_be_updated.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&cur_move_1.node);
        }
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](G,(long)cur_move_1.node);
        __end4 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
        _toLHS = std::vector<int,_std::allocator<int>_>::end(pvVar5);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                           *)&toLHS), bVar2) {
          piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end4);
          toRHS = *piVar6;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this->x,(long)toRHS);
          if (*pvVar4 < 0) {
            pvVar8 = std::vector<maxNodeHeap,_std::allocator<maxNodeHeap>_>::operator[](queues,0);
            uVar3 = (*(pvVar8->super_priority_queue_interface)._vptr_priority_queue_interface[0xd])
                              (pvVar8,(ulong)(uint)toRHS);
            if ((uVar3 & 1) != 0) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)local_80,&toRHS);
            }
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end4);
        }
      }
      else {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (this->partition_index,(long)cur_move_1.node);
        if (*pvVar4 == 2) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_80,&cur_move_1.node);
        }
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  local_f0 = 0;
  __range1_1._4_4_ = 0;
  this_00 = &to_be_updated.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)this_00);
  iStack_110 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)this_00);
  while (bVar2 = __gnu_cxx::operator!=(&__end1_1,&stack0xfffffffffffffef0), bVar2) {
    puVar7 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end1_1);
    uVar3 = *puVar7;
    compute_gain(this,G,uVar3,(Gain *)&local_f0,(Gain *)((long)&__range1_1 + 4));
    pvVar8 = std::vector<maxNodeHeap,_std::allocator<maxNodeHeap>_>::operator[](queues,0);
    (*(pvVar8->super_priority_queue_interface)._vptr_priority_queue_interface[4])
              (pvVar8,(ulong)uVar3,(ulong)local_f0);
    pvVar8 = std::vector<maxNodeHeap,_std::allocator<maxNodeHeap>_>::operator[](queues,1);
    (*(pvVar8->super_priority_queue_interface)._vptr_priority_queue_interface[4])
              (pvVar8,(ulong)uVar3,(ulong)__range1_1._4_4_);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  __end1_2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_80);
  iStack_130 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_80);
  while (bVar2 = __gnu_cxx::operator!=(&__end1_2,&stack0xfffffffffffffed0), bVar2) {
    puVar7 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end1_2);
    uVar3 = *puVar7;
    compute_gain(this,G,uVar3,(Gain *)&local_f0,(Gain *)((long)&__range1_1 + 4));
    pvVar8 = std::vector<maxNodeHeap,_std::allocator<maxNodeHeap>_>::operator[](queues,0);
    (*(pvVar8->super_priority_queue_interface)._vptr_priority_queue_interface[10])
              (pvVar8,(ulong)uVar3,(ulong)local_f0);
    pvVar8 = std::vector<maxNodeHeap,_std::allocator<maxNodeHeap>_>::operator[](queues,1);
    (*(pvVar8->super_priority_queue_interface)._vptr_priority_queue_interface[10])
              (pvVar8,(ulong)uVar3,(ulong)__range1_1._4_4_);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_2);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &to_be_updated.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

inline
void fm_ns_local_search::move_node( AdjList & G, NodeID & node, PartitionID & to_block, PartitionID & other_block, 
                                    std::vector< NodeWeight > & block_weights,
                                    std::vector< bool > & moved_out_of_S, 
                                    std::vector< maxNodeHeap > & queues,
                                    std::vector< change_set > & rollback_info) {

        change_set cur_move;
        cur_move.node = node;
        cur_move.block = partition_index[node];
        rollback_info.push_back(cur_move);

        partition_index[node] = to_block;
        block_weights[to_block] += 1;
        block_weights[2] -= 1;
        moved_out_of_S[node] = true;

        std::vector<NodeID> to_be_added;
        std::vector<NodeID> to_be_updated; // replace by hashmap?
        Gain gain_achieved = 1;

        for (int neighbor : G[node])
        {
                if (x[neighbor] < 0) {
                        if (partition_index[neighbor] == other_block) {
                                change_set cur_move;
                                cur_move.node = neighbor;
                                cur_move.block = partition_index[neighbor];
                                rollback_info.push_back(cur_move);

                                partition_index[neighbor] = 2;
                                block_weights[other_block] -= 1;
                                block_weights[2]           += 1;
                                gain_achieved              -= 1;

                                if(!moved_out_of_S[neighbor]) {
                                        to_be_added.push_back(neighbor);
                                }

                                for (int v : G[neighbor]) {
                                        if(x[v] < 0) {
                                                if (queues[0].contains(v)) {
                                                        to_be_updated.push_back(v);
                                                }
                                        }
                                }

                        } else if(partition_index[neighbor] == 2) {
                                to_be_updated.push_back(neighbor);
                        }
                }
        }

        Gain toLHS = 0;
        Gain toRHS = 0;

        for(NodeID node : to_be_added) {
                compute_gain(G, node, toLHS, toRHS);
                queues[0].insert(node, toLHS);
                queues[1].insert(node, toRHS);
        }

        for(NodeID node : to_be_updated) {
                compute_gain(G, node, toLHS, toRHS);
                queues[0].changeKey(node, toLHS);
                queues[1].changeKey(node, toRHS);
        }
}